

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O1

void Cmd_invnext(FCommandLine *argv,APlayerPawn *who,int key)

{
  AInventory *pAVar1;
  FFont *font;
  DBaseStatusBar *this;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar2;
  DHUDMessageFadeOut *this_00;
  char *text;
  
  if (who == (APlayerPawn *)0x0) {
    return;
  }
  pAVar1 = (who->InvSel).field_0.p;
  if (pAVar1 == (AInventory *)0x0) goto LAB_0038726b;
  if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
    aVar2.p = AInventory::NextInv((who->InvSel).field_0.p);
    if (aVar2.p == (AInventory *)0x0) {
      if ((((who->super_AActor).Inventory.field_0.p)->ItemFlags & 0x40) == 0) {
        aVar2.p = AInventory::NextInv((who->super_AActor).Inventory.field_0.p);
      }
      else {
        aVar2 = (who->super_AActor).Inventory.field_0;
      }
    }
    (who->InvSel).field_0.p = (AInventory *)aVar2;
    this = StatusBar;
    if ((((((byte)displaynametags.Value & 1) == 0) || (StatusBar == (DBaseStatusBar *)0x0)) ||
        (SmallFont == (FFont *)0x0)) ||
       (pAVar1 = (who->InvSel).field_0.p, pAVar1 == (AInventory *)0x0)) goto LAB_0038726b;
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      this_00 = (DHUDMessageFadeOut *)
                M_Malloc_Dbg(200,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                             ,0x1f9);
      font = SmallFont;
      text = AActor::GetTag(&((who->InvSel).field_0.p)->super_AActor,(char *)0x0);
      DHUDMessageFadeOut::DHUDMessageFadeOut
                (this_00,font,text,1.5,0.8,0,0,nametagcolor.Value,2.0,0.35);
      DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x564e4953,0);
      goto LAB_0038726b;
    }
  }
  (who->InvSel).field_0.p = (AInventory *)0x0;
LAB_0038726b:
  ((who->super_AActor).player)->inventorytics = 0xaf;
  return;
}

Assistant:

CCMD (invnext)
{
	AInventory *next;

	if (who == NULL)
		return;

	if (who->InvSel != NULL)
	{
		if ((next = who->InvSel->NextInv()) != NULL)
		{
			who->InvSel = next;
		}
		else
		{
			// Select the first item in the inventory
			if (!(who->Inventory->ItemFlags & IF_INVBAR))
			{
				who->InvSel = who->Inventory->NextInv();
			}
			else
			{
				who->InvSel = who->Inventory;
			}
		}
		if ((displaynametags & 1) && StatusBar && SmallFont && who->InvSel)
			StatusBar->AttachMessage (new DHUDMessageFadeOut (SmallFont, who->InvSel->GetTag(), 
			1.5f, 0.80f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID('S','I','N','V'));
	}
	who->player->inventorytics = 5*TICRATE;
}